

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

int decode_hex4(char *hex)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int digit [4];
  
  lVar1 = 0;
  do {
    bVar2 = hex[lVar1];
    iVar3 = -0x30;
    if (9 < (byte)(bVar2 - 0x30)) {
      bVar2 = bVar2 | 0x20;
      iVar3 = -0x57;
      if (5 < (byte)(bVar2 + 0x9f)) {
        return -1;
      }
    }
    digit[lVar1] = (uint)bVar2 + iVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return digit[2] * 0x10 + digit[1] * 0x100 + digit[0] * 0x1000 + digit[3];
}

Assistant:

static int decode_hex4(const char *hex)
{
    int digit[4];
    int i;

    /* Convert ASCII hex digit to numeric digit
     * Note: this returns an error for invalid hex digits, including
     *       NULL */
    for (i = 0; i < 4; i++) {
        digit[i] = hexdigit2int(hex[i]);
        if (digit[i] < 0) {
            return -1;
        }
    }

    return (digit[0] << 12) +
           (digit[1] << 8) +
           (digit[2] << 4) +
            digit[3];
}